

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModportDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportDeclarationSyntax,slang::syntax::ModportDeclarationSyntax_const&>
          (BumpAllocator *this,ModportDeclarationSyntax *args)

{
  ModportDeclarationSyntax *this_00;
  
  this_00 = (ModportDeclarationSyntax *)allocate(this,0xa8,8);
  slang::syntax::ModportDeclarationSyntax::ModportDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }